

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

bool __thiscall sf::priv::WindowImplX11::processEvent(WindowImplX11 *this,XEvent *windowEvent)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Atom AVar4;
  EVP_PKEY_CTX *in_RSI;
  WindowImplX11 *in_RDI;
  Event event_12;
  Event event_11;
  Event event_10;
  Event event_9;
  Event event_8;
  Event event_7;
  uint button_1;
  Event event_6;
  uint button;
  Event event_5;
  Event textEvent_1;
  char keyBuffer_1 [16];
  Event textEvent;
  Uint8 *iter;
  Uint32 unicode;
  int length;
  Uint8 keyBuffer [64];
  int status_1;
  bool filtered;
  Event event_4;
  Event event_3;
  Event event_2;
  Event event_1;
  XWMHints *hints;
  Event event;
  int result;
  uint trial;
  Event *in_stack_fffffffffffffd18;
  WindowImpl *in_stack_fffffffffffffd20;
  XKeyEvent *in_stack_fffffffffffffd28;
  bitset<256UL> *in_stack_fffffffffffffd30;
  Atom local_2b8;
  undefined8 in_stack_fffffffffffffd50;
  undefined1 onlyIfExists;
  string *in_stack_fffffffffffffd58;
  string *name;
  Time in_stack_fffffffffffffd78;
  WindowImplX11 *in_stack_fffffffffffffd80;
  allocator *paVar5;
  undefined1 local_1a8 [28];
  undefined4 local_18c;
  Uint32 local_188;
  uchar *local_178;
  Uint32 local_170;
  int local_16c;
  uchar local_168 [76];
  int local_11c;
  byte local_115;
  undefined4 local_114;
  Key local_110;
  Scancode local_10c;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined4 local_100;
  byte local_eb;
  byte local_ea;
  undefined1 local_e9 [40];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_54;
  ulong *local_40;
  undefined4 local_34;
  Int64 local_20;
  int local_18;
  uint local_14;
  EVP_PKEY_CTX *local_10;
  
  onlyIfExists = (undefined1)((ulong)in_stack_fffffffffffffd50 >> 0x38);
  local_10 = in_RSI;
  switch(*(undefined4 *)in_RSI) {
  case 2:
    local_114 = 5;
    local_110 = KeyboardImpl::getKeyFromEvent(in_stack_fffffffffffffd28);
    local_10c = KeyboardImpl::getScancodeFromEvent((XKeyEvent *)0x2678e0);
    local_108 = (*(uint *)(local_10 + 0x50) & 8) != 0;
    local_107 = (*(uint *)(local_10 + 0x50) & 4) != 0;
    local_106 = (*(uint *)(local_10 + 0x50) & 1) != 0;
    local_105 = (*(uint *)(local_10 + 0x50) & 0x40) != 0;
    iVar2 = XFilterEvent(local_10,0);
    local_115 = iVar2 != 0;
    if ((bool)local_115) {
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      std::bitset<256UL>::set
                (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 SUB81((ulong)in_stack_fffffffffffffd20 >> 0x38,0));
    }
    else {
      bVar1 = std::bitset<256UL>::test
                        ((bitset<256UL> *)in_stack_fffffffffffffd20,
                         (size_t)in_stack_fffffffffffffd18);
      if ((!bVar1) && (*(int *)(local_10 + 0x54) != 0)) {
        WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
    }
    if ((local_115 & 1) == 0) {
      if (in_RDI->m_inputContext == (XIC)0x0) {
        iVar2 = XLookupString(local_10,local_1a8,0x10,0,&processEvent::status);
        if (iVar2 != 0) {
          WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        }
      }
      else {
        local_16c = Xutf8LookupString(in_RDI->m_inputContext,local_10,local_168,0x40,0,&local_11c);
        if (local_11c == -1) {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "A TextEntered event has more than 64 bytes of UTF-8 input, and has been discarded\nThis means either you have typed a very long string (more than 20 chars), or your input method is broken in obscure ways."
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        else if (local_11c == 2) {
          local_170 = 0;
          local_178 = local_168;
          while (local_178 < local_168 + local_16c) {
            local_178 = Utf<8u>::decode<unsigned_char*>
                                  (local_178,local_168 + local_16c,&local_170,0);
            if (local_170 != 0) {
              local_18c = 4;
              local_188 = local_170;
              WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
            }
          }
        }
      }
    }
    updateLastInputTime(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    break;
  case 3:
    KeyboardImpl::getKeyFromEvent(in_stack_fffffffffffffd28);
    KeyboardImpl::getScancodeFromEvent((XKeyEvent *)0x267bdf);
    WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    break;
  case 4:
    iVar2 = *(int *)(in_RSI + 0x54);
    if ((((iVar2 == 1) || (iVar2 == 2)) || (iVar2 == 3)) || ((iVar2 == 8 || (iVar2 == 9)))) {
      switch(iVar2) {
      case 1:
        break;
      case 2:
        break;
      case 3:
        break;
      case 8:
        break;
      case 9:
      }
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    updateLastInputTime(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    break;
  case 5:
    iVar2 = *(int *)(in_RSI + 0x54);
    if ((((iVar2 == 1) || (iVar2 == 2)) || (iVar2 == 3)) || ((iVar2 == 8 || (iVar2 == 9)))) {
      switch(iVar2) {
      case 1:
        break;
      case 2:
        break;
      case 3:
        break;
      case 8:
        break;
      case 9:
      }
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    else if ((iVar2 == 4) || (iVar2 == 5)) {
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    else if ((iVar2 == 6) || (iVar2 == 7)) {
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    break;
  case 6:
    WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    break;
  case 7:
    if (*(int *)(in_RSI + 0x50) == 0) {
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    break;
  case 8:
    if (*(int *)(in_RSI + 0x50) == 0) {
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    break;
  case 9:
    if (in_RDI->m_inputContext != (XIC)0x0) {
      XSetICFocus(in_RDI->m_inputContext);
    }
    if ((in_RDI->m_cursorGrabbed & 1U) != 0) {
      for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
        in_stack_fffffffffffffd18 = (Event *)in_RDI->m_window;
        in_stack_fffffffffffffd20 = (WindowImpl *)0x0;
        local_18 = XGrabPointer(in_RDI->m_display,in_RDI->m_window,1,0,1);
        if (local_18 == 0) {
          in_RDI->m_cursorGrabbed = true;
          break;
        }
        local_20 = (Int64)milliseconds((Int32)((ulong)in_stack_fffffffffffffd18 >> 0x20));
        sleep((uint)local_20);
      }
      if ((in_RDI->m_cursorGrabbed & 1U) == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,"Failed to grab mouse cursor");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    local_34 = 3;
    WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_40 = (ulong *)XGetWMHints(in_RDI->m_display,in_RDI->m_window);
    if (local_40 != (ulong *)0x0) {
      *local_40 = *local_40 & 0xfffffffffffffeff;
      XSetWMHints(in_RDI->m_display,in_RDI->m_window,local_40);
      XFree(local_40);
    }
    break;
  case 10:
    if (in_RDI->m_inputContext != (XIC)0x0) {
      XUnsetICFocus(in_RDI->m_inputContext);
    }
    if ((in_RDI->m_cursorGrabbed & 1U) != 0) {
      XUngrabPointer(in_RDI->m_display,0);
    }
    local_54 = 2;
    WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    break;
  case 0xf:
    if ((*(Window *)(in_RSI + 0x20) == in_RDI->m_window) && (*(int *)(in_RSI + 0x28) != 2)) {
      in_RDI->m_windowMapped = true;
    }
    break;
  case 0x11:
    cleanup(in_RDI,in_RSI);
    break;
  case 0x12:
    if (*(Window *)(in_RSI + 0x28) == in_RDI->m_window) {
      in_RDI->m_windowMapped = false;
    }
    break;
  case 0x16:
    if ((*(int *)(in_RSI + 0x38) != (in_RDI->m_previousSize).x) ||
       (*(int *)(in_RSI + 0x3c) != (in_RDI->m_previousSize).y)) {
      local_68 = 1;
      local_64 = *(undefined4 *)(in_RSI + 0x38);
      local_60 = *(undefined4 *)(in_RSI + 0x3c);
      WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      (in_RDI->m_previousSize).x = *(int *)(local_10 + 0x38);
      (in_RDI->m_previousSize).y = *(int *)(local_10 + 0x3c);
    }
    break;
  case 0x1c:
    if (in_RDI->m_lastInputTime == 0) {
      in_RDI->m_lastInputTime = *(Time *)(in_RSI + 0x30);
    }
    break;
  case 0x21:
    iVar2 = XFilterEvent(in_RSI,0);
    if (iVar2 == 0) {
      if ((processEvent(_XEvent&)::wmProtocols == '\0') &&
         (iVar2 = __cxa_guard_acquire(&processEvent(_XEvent&)::wmProtocols), iVar2 != 0)) {
        paVar5 = &local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,"WM_PROTOCOLS",paVar5);
        AVar4 = getAtom(in_stack_fffffffffffffd58,(bool)onlyIfExists);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        processEvent::wmProtocols = AVar4;
        __cxa_guard_release(&processEvent(_XEvent&)::wmProtocols);
      }
      if (*(Atom *)(local_10 + 0x28) == processEvent::wmProtocols) {
        if ((processEvent(_XEvent&)::wmDeleteWindow == '\0') &&
           (iVar2 = __cxa_guard_acquire(&processEvent(_XEvent&)::wmDeleteWindow), iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c0,"WM_DELETE_WINDOW",&local_c1);
          AVar4 = getAtom(in_stack_fffffffffffffd58,(bool)onlyIfExists);
          std::__cxx11::string::~string(local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
          processEvent::wmDeleteWindow = AVar4;
          __cxa_guard_release(&processEvent(_XEvent&)::wmDeleteWindow);
        }
        if ((processEvent(_XEvent&)::netWmPing == '\0') &&
           (iVar2 = __cxa_guard_acquire(&processEvent(_XEvent&)::netWmPing), iVar2 != 0)) {
          local_ea = 0;
          local_eb = 0;
          bVar1 = anon_unknown.dwarf_23372c::WindowsImplX11Impl::ewmhSupported();
          if (bVar1) {
            name = (string *)local_e9;
            std::allocator<char>::allocator();
            local_ea = 1;
            std::__cxx11::string::string((string *)(local_e9 + 1),"_NET_WM_PING",(allocator *)name);
            local_eb = 1;
            local_2b8 = getAtom(name,(bool)onlyIfExists);
          }
          else {
            local_2b8 = 0;
          }
          if ((local_eb & 1) != 0) {
            std::__cxx11::string::~string((string *)(local_e9 + 1));
          }
          if ((local_ea & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)local_e9);
          }
          processEvent::netWmPing = local_2b8;
          __cxa_guard_release(&processEvent(_XEvent&)::netWmPing);
        }
        if ((*(int *)(local_10 + 0x30) == 0x20) &&
           (*(Atom *)(local_10 + 0x38) == processEvent::wmDeleteWindow)) {
          local_100 = 0;
          WindowImpl::pushEvent(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        }
        else if ((processEvent::netWmPing != 0) &&
                ((*(int *)(local_10 + 0x30) == 0x20 &&
                 (*(Atom *)(local_10 + 0x38) == processEvent::netWmPing)))) {
          *(undefined8 *)(local_10 + 0x20) =
               *(undefined8 *)
                (*(long *)(in_RDI->m_display + 0xe8) +
                 (long)*(int *)(in_RDI->m_display + 0xe0) * 0x80 + 0x10);
          XSendEvent(in_RDI->m_display,
                     *(undefined8 *)
                      (*(long *)(in_RDI->m_display + 0xe8) +
                       (long)*(int *)(in_RDI->m_display + 0xe0) * 0x80 + 0x10),0,0x180000,local_10);
        }
      }
    }
    break;
  case 0x22:
    if (*(int *)(in_RSI + 0x28) == 1) {
      XRefreshKeyboardMapping(in_RSI);
    }
  }
  return true;
}

Assistant:

bool WindowImplX11::processEvent(XEvent& windowEvent)
{
    using namespace WindowsImplX11Impl;

    // Convert the X11 event to a sf::Event
    switch (windowEvent.type)
    {
        // Destroy event
        case DestroyNotify:
        {
            // The window is about to be destroyed: we must cleanup resources
            cleanup();
            break;
        }

        // Gain focus event
        case FocusIn:
        {
            // Update the input context
            if (m_inputContext)
                XSetICFocus(m_inputContext);

            // Grab cursor
            if (m_cursorGrabbed)
            {
                // Try multiple times to grab the cursor
                for (unsigned int trial = 0; trial < maxTrialsCount; ++trial)
                {
                    int result = XGrabPointer(m_display, m_window, True, None, GrabModeAsync, GrabModeAsync, m_window, None, CurrentTime);

                    if (result == GrabSuccess)
                    {
                        m_cursorGrabbed = true;
                        break;
                    }

                    // The cursor grab failed, trying again after a small sleep
                    sf::sleep(sf::milliseconds(50));
                }

                if (!m_cursorGrabbed)
                    err() << "Failed to grab mouse cursor" << std::endl;
            }

            Event event;
            event.type = Event::GainedFocus;
            pushEvent(event);

            // If the window has been previously marked urgent (notification) as a result of a focus request, undo that
            XWMHints* hints = XGetWMHints(m_display, m_window);
            if (hints != NULL)
            {
                // Remove urgency (notification) flag from hints
                hints->flags &= ~XUrgencyHint;
                XSetWMHints(m_display, m_window, hints);
                XFree(hints);
            }

            break;
        }

        // Lost focus event
        case FocusOut:
        {
            // Update the input context
            if (m_inputContext)
                XUnsetICFocus(m_inputContext);

            // Release cursor
            if (m_cursorGrabbed)
                XUngrabPointer(m_display, CurrentTime);

            Event event;
            event.type = Event::LostFocus;
            pushEvent(event);
            break;
        }

        // Resize event
        case ConfigureNotify:
        {
            // ConfigureNotify can be triggered for other reasons, check if the size has actually changed
            if ((windowEvent.xconfigure.width != m_previousSize.x) || (windowEvent.xconfigure.height != m_previousSize.y))
            {
                Event event;
                event.type        = Event::Resized;
                event.size.width  = static_cast<unsigned int>(windowEvent.xconfigure.width);
                event.size.height = static_cast<unsigned int>(windowEvent.xconfigure.height);
                pushEvent(event);

                m_previousSize.x = windowEvent.xconfigure.width;
                m_previousSize.y = windowEvent.xconfigure.height;
            }
            break;
        }

        // Close event
        case ClientMessage:
        {
            // Input methods might want random ClientMessage events
            if (!XFilterEvent(&windowEvent, None))
            {
                static Atom wmProtocols = getAtom("WM_PROTOCOLS");

                // Handle window manager protocol messages we support
                if (windowEvent.xclient.message_type == wmProtocols)
                {
                    static Atom wmDeleteWindow = getAtom("WM_DELETE_WINDOW");
                    static Atom netWmPing = ewmhSupported() ? getAtom("_NET_WM_PING", true) : None;

                    if ((windowEvent.xclient.format == 32) && (windowEvent.xclient.data.l[0]) == static_cast<long>(wmDeleteWindow))
                    {
                        // Handle the WM_DELETE_WINDOW message
                        Event event;
                        event.type = Event::Closed;
                        pushEvent(event);
                    }
                    else if (netWmPing && (windowEvent.xclient.format == 32) && (windowEvent.xclient.data.l[0]) == static_cast<long>(netWmPing))
                    {
                        // Handle the _NET_WM_PING message, send pong back to WM to show that we are responsive
                        windowEvent.xclient.window = DefaultRootWindow(m_display);

                        XSendEvent(m_display, DefaultRootWindow(m_display), False, SubstructureNotifyMask | SubstructureRedirectMask, &windowEvent);
                    }
                }
            }
            break;
        }

        // Key down event
        case KeyPress:
        {
            // Fill the event parameters
            // TODO: if modifiers are wrong, use XGetModifierMapping to retrieve the actual modifiers mapping
            Event event;
            event.type         = Event::KeyPressed;
            event.key.code     = KeyboardImpl::getKeyFromEvent(windowEvent.xkey);
            event.key.scancode = KeyboardImpl::getScancodeFromEvent(windowEvent.xkey);
            event.key.alt      = windowEvent.xkey.state & Mod1Mask;
            event.key.control  = windowEvent.xkey.state & ControlMask;
            event.key.shift    = windowEvent.xkey.state & ShiftMask;
            event.key.system   = windowEvent.xkey.state & Mod4Mask;

            const bool filtered = XFilterEvent(&windowEvent, None);

            // Generate a KeyPressed event if needed
            if (filtered)
            {
                pushEvent(event);
                isKeyFiltered.set(windowEvent.xkey.keycode);
            }
            else
            {
                // Push a KeyPressed event if the key has never been filtered before
                // (a KeyPressed event would have already been pushed if it had been filtered).
                //
                // Some dummy IMs (like the built-in one you get by setting XMODIFIERS=@im=none)
                // never filter events away, and we have to take care of that.
                //
                // In addition, ignore text-only KeyPress events generated by IMs (with keycode set to 0).
                if (!isKeyFiltered.test(windowEvent.xkey.keycode) && windowEvent.xkey.keycode != 0)
                    pushEvent(event);
            }

            // Generate TextEntered events if needed
            if (!filtered)
            {
                #ifdef X_HAVE_UTF8_STRING
                if (m_inputContext)
                {
                    Status status;
                    Uint8  keyBuffer[64];

                    int length = Xutf8LookupString(
                        m_inputContext,
                        &windowEvent.xkey,
                        reinterpret_cast<char*>(keyBuffer),
                        sizeof(keyBuffer),
                        NULL,
                        &status
                    );

                    if (status == XBufferOverflow)
                        err() << "A TextEntered event has more than 64 bytes of UTF-8 input, and "
                                 "has been discarded\nThis means either you have typed a very long string "
                                 "(more than 20 chars), or your input method is broken in obscure ways." << std::endl;
                    else if (status == XLookupChars)
                    {
                        // There might be more than 1 characters in this event,
                        // so we must iterate it
                        Uint32 unicode = 0;
                        Uint8* iter = keyBuffer;
                        while (iter < keyBuffer + length)
                        {
                            iter = Utf8::decode(iter, keyBuffer + length, unicode, 0);
                            if (unicode != 0)
                            {
                                Event textEvent;
                                textEvent.type         = Event::TextEntered;
                                textEvent.text.unicode = unicode;
                                pushEvent(textEvent);
                            }
                        }
                    }
                }
                else
                #endif
                {
                    static XComposeStatus status;
                    char keyBuffer[16];
                    if (XLookupString(&windowEvent.xkey, keyBuffer, sizeof(keyBuffer), NULL, &status))
                    {
                        Event textEvent;
                        textEvent.type         = Event::TextEntered;
                        textEvent.text.unicode = static_cast<Uint32>(keyBuffer[0]);
                        pushEvent(textEvent);
                    }
                }
            }

            updateLastInputTime(windowEvent.xkey.time);

            break;
        }

        // Key up event
        case KeyRelease:
        {
            // Fill the event parameters
            Event event;
            event.type         = Event::KeyReleased;
            event.key.code     = KeyboardImpl::getKeyFromEvent(windowEvent.xkey);
            event.key.scancode = KeyboardImpl::getScancodeFromEvent(windowEvent.xkey);
            event.key.alt      = windowEvent.xkey.state & Mod1Mask;
            event.key.control  = windowEvent.xkey.state & ControlMask;
            event.key.shift    = windowEvent.xkey.state & ShiftMask;
            event.key.system   = windowEvent.xkey.state & Mod4Mask;
            pushEvent(event);

            break;
        }

        // Mouse button pressed
        case ButtonPress:
        {
            // Buttons 4 and 5 are the vertical wheel and 6 and 7 the horizontal wheel.
            unsigned int button = windowEvent.xbutton.button;
            if ((button == Button1) ||
                (button == Button2) ||
                (button == Button3) ||
                (button == 8) ||
                (button == 9))
            {
                Event event;
                event.type          = Event::MouseButtonPressed;
                event.mouseButton.x = windowEvent.xbutton.x;
                event.mouseButton.y = windowEvent.xbutton.y;
                switch(button)
                {
                    case Button1: event.mouseButton.button = Mouse::Left;     break;
                    case Button2: event.mouseButton.button = Mouse::Middle;   break;
                    case Button3: event.mouseButton.button = Mouse::Right;    break;
                    case 8:       event.mouseButton.button = Mouse::XButton1; break;
                    case 9:       event.mouseButton.button = Mouse::XButton2; break;
                }
                pushEvent(event);
            }

            updateLastInputTime(windowEvent.xbutton.time);

            break;
        }

        // Mouse button released
        case ButtonRelease:
        {
            unsigned int button = windowEvent.xbutton.button;
            if ((button == Button1) ||
                (button == Button2) ||
                (button == Button3) ||
                (button == 8) ||
                (button == 9))
            {
                Event event;
                event.type          = Event::MouseButtonReleased;
                event.mouseButton.x = windowEvent.xbutton.x;
                event.mouseButton.y = windowEvent.xbutton.y;
                switch(button)
                {
                    case Button1: event.mouseButton.button = Mouse::Left;     break;
                    case Button2: event.mouseButton.button = Mouse::Middle;   break;
                    case Button3: event.mouseButton.button = Mouse::Right;    break;
                    case 8:       event.mouseButton.button = Mouse::XButton1; break;
                    case 9:       event.mouseButton.button = Mouse::XButton2; break;
                }
                pushEvent(event);
            }
            else if ((button == Button4) || (button == Button5))
            {
                Event event;

                event.type             = Event::MouseWheelMoved;
                event.mouseWheel.delta = (button == Button4) ? 1 : -1;
                event.mouseWheel.x     = windowEvent.xbutton.x;
                event.mouseWheel.y     = windowEvent.xbutton.y;
                pushEvent(event);

                event.type                   = Event::MouseWheelScrolled;
                event.mouseWheelScroll.wheel = Mouse::VerticalWheel;
                event.mouseWheelScroll.delta = (button == Button4) ? 1 : -1;
                event.mouseWheelScroll.x     = windowEvent.xbutton.x;
                event.mouseWheelScroll.y     = windowEvent.xbutton.y;
                pushEvent(event);
            }
            else if ((button == 6) || (button == 7))
            {
                Event event;
                event.type                   = Event::MouseWheelScrolled;
                event.mouseWheelScroll.wheel = Mouse::HorizontalWheel;
                event.mouseWheelScroll.delta = (button == 6) ? 1 : -1;
                event.mouseWheelScroll.x     = windowEvent.xbutton.x;
                event.mouseWheelScroll.y     = windowEvent.xbutton.y;
                pushEvent(event);
            }
            break;
        }

        // Mouse moved
        case MotionNotify:
        {
            Event event;
            event.type        = Event::MouseMoved;
            event.mouseMove.x = windowEvent.xmotion.x;
            event.mouseMove.y = windowEvent.xmotion.y;
            pushEvent(event);
            break;
        }

        // Mouse entered
        case EnterNotify:
        {
            if (windowEvent.xcrossing.mode == NotifyNormal)
            {
                Event event;
                event.type = Event::MouseEntered;
                pushEvent(event);
            }
            break;
        }

        // Mouse left
        case LeaveNotify:
        {
            if (windowEvent.xcrossing.mode == NotifyNormal)
            {
                Event event;
                event.type = Event::MouseLeft;
                pushEvent(event);
            }
            break;
        }

        // Keyboard mapping changed
        case MappingNotify:
        {
            if (windowEvent.xmapping.request == MappingKeyboard)
                XRefreshKeyboardMapping(&windowEvent.xmapping);

            break;
        }

        // Window unmapped
        case UnmapNotify:
        {
            if (windowEvent.xunmap.window == m_window)
                m_windowMapped = false;

            break;
        }

        // Window visibility change
        case VisibilityNotify:
        {
            // We prefer using VisibilityNotify over MapNotify because
            // some window managers like awesome don't internally flag a
            // window as viewable even after it is mapped but before it
            // is visible leading to certain function calls failing with
            // an unviewable error if called before VisibilityNotify arrives

            // Empirical testing on most widely used window managers shows
            // that mapping a window will always lead to a VisibilityNotify
            // event that is not VisibilityFullyObscured
            if (windowEvent.xvisibility.window == m_window)
            {
                if (windowEvent.xvisibility.state != VisibilityFullyObscured)
                    m_windowMapped = true;
            }

            break;
        }

        // Window property change
        case PropertyNotify:
        {
            if (!m_lastInputTime)
                m_lastInputTime = windowEvent.xproperty.time;

            break;
        }
    }

    return true;
}